

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O0

bool duckdb::TryDecimalStringCast<short,(char)46>
               (char *string_ptr,idx_t string_size,short *result,uint8_t width,uint8_t scale)

{
  bool bVar1;
  short sVar2;
  byte in_CL;
  undefined2 *in_RDX;
  undefined1 in_R8B;
  DecimalCastData<short> state;
  DecimalCastData<short> *in_stack_ffffffffffffffc8;
  undefined2 in_stack_ffffffffffffffd0;
  undefined2 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  byte bVar11;
  
  uVar3 = 0;
  uVar4 = 0;
  uVar5 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar6 = 0;
  uVar7 = 0;
  uVar10 = in_R8B;
  bVar11 = in_CL;
  sVar2 = UnsafeNumericCast<short,long,void>
                    (*(long *)(NumericHelper::POWERS_OF_TEN + (ulong)in_CL * 8));
  bVar1 = TryIntegerCast<duckdb::DecimalCastData<short>,true,true,duckdb::DecimalCastOperation,false,(char)46>
                    ((char *)CONCAT17(bVar11,CONCAT16(uVar10,CONCAT24(sVar2,CONCAT13(uVar9,CONCAT12(
                                                  uVar8,CONCAT11(uVar7,uVar6)))))),
                     CONCAT17(uVar5,CONCAT16(uVar4,CONCAT15(in_R8B,CONCAT14(in_CL,CONCAT22(uVar3,
                                                  in_stack_ffffffffffffffd0))))),
                     in_stack_ffffffffffffffc8,false);
  if (bVar1) {
    *in_RDX = uVar3;
  }
  return bVar1;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}